

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::remove_mblur(SceneGraph *this,Ref<embree::SceneGraph::Node> *node,bool mblur)

{
  Node *pNVar1;
  long lVar2;
  long *plVar3;
  bool bVar4;
  long *plVar5;
  SceneGraph *pSVar6;
  ulong uVar7;
  long local_60;
  Ref<embree::SceneGraph::Node> local_58;
  Ref<embree::SceneGraph::Node> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> *local_40;
  Node *local_38;
  
  pNVar1 = node->ptr;
  if (pNVar1 == (Node *)0x0) goto LAB_0014ad29;
  plVar5 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TransformNode::typeinfo,0);
  if (plVar5 == (long *)0x0) {
    plVar5 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    if (plVar5 == (long *)0x0) {
      plVar5 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GroupNode::typeinfo,0);
      if (plVar5 == (long *)0x0) {
        plVar5 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        if (plVar5 == (long *)0x0) {
          plVar5 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          if (plVar5 == (long *)0x0) {
            plVar5 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&SubdivMeshNode::typeinfo,0);
            if (plVar5 == (long *)0x0) {
              plVar5 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&HairSetNode::typeinfo,0);
              if (plVar5 == (long *)0x0) {
                plVar5 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&PointSetNode::typeinfo,0);
                if (plVar5 != (long *)0x0) {
                  (**(code **)(*plVar5 + 0x10))(plVar5);
                  if ((ulong)(plVar5[0x10] - plVar5[0xf]) < 0x21 != mblur) {
                    *(undefined8 *)this = 0;
                    (**(code **)(*plVar5 + 0x18))(plVar5);
                    return (Ref<embree::SceneGraph::Node>)(Node *)this;
                  }
                  (**(code **)(*plVar5 + 0x18))(plVar5);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x10))(plVar5);
                if ((ulong)(plVar5[0x10] - plVar5[0xf]) < 0x21 != mblur) {
                  *(undefined8 *)this = 0;
                  (**(code **)(*plVar5 + 0x18))(plVar5);
                  return (Ref<embree::SceneGraph::Node>)(Node *)this;
                }
                (**(code **)(*plVar5 + 0x18))(plVar5);
              }
            }
            else {
              (**(code **)(*plVar5 + 0x10))(plVar5);
              if ((ulong)(plVar5[0xf] - plVar5[0xe]) < 0x21 != mblur) {
                *(undefined8 *)this = 0;
                (**(code **)(*plVar5 + 0x18))(plVar5);
                return (Ref<embree::SceneGraph::Node>)(Node *)this;
              }
              (**(code **)(*plVar5 + 0x18))(plVar5);
            }
          }
          else {
            (**(code **)(*plVar5 + 0x10))(plVar5);
            if ((ulong)(plVar5[0xf] - plVar5[0xe]) < 0x21 != mblur) {
              *(undefined8 *)this = 0;
              (**(code **)(*plVar5 + 0x18))(plVar5);
              return (Ref<embree::SceneGraph::Node>)(Node *)this;
            }
            (**(code **)(*plVar5 + 0x18))(plVar5);
          }
        }
        else {
          (**(code **)(*plVar5 + 0x10))(plVar5);
          if ((ulong)(plVar5[0xf] - plVar5[0xe]) < 0x21 != mblur) {
            *(undefined8 *)this = 0;
            (**(code **)(*plVar5 + 0x18))(plVar5);
            return (Ref<embree::SceneGraph::Node>)(Node *)this;
          }
          (**(code **)(*plVar5 + 0x18))(plVar5);
        }
      }
      else {
        local_40 = node;
        local_38 = (Node *)this;
        (**(code **)(*plVar5 + 0x10))(plVar5);
        for (uVar7 = 0; uVar7 < (ulong)(plVar5[0xe] - plVar5[0xd] >> 3); uVar7 = uVar7 + 1) {
          local_58.ptr = *(Node **)(plVar5[0xd] + uVar7 * 8);
          if (local_58.ptr != (Node *)0x0) {
            (*((local_58.ptr)->super_RefCount)._vptr_RefCount[2])();
          }
          remove_mblur((SceneGraph *)&local_60,&local_58,mblur);
          lVar2 = plVar5[0xd];
          plVar3 = *(long **)(lVar2 + uVar7 * 8);
          if (plVar3 != (long *)0x0) {
            (**(code **)(*plVar3 + 0x18))();
          }
          *(long *)(lVar2 + uVar7 * 8) = local_60;
          if (local_58.ptr != (Node *)0x0) {
            (*((local_58.ptr)->super_RefCount)._vptr_RefCount[3])();
          }
        }
        (**(code **)(*plVar5 + 0x18))(plVar5);
        node = local_40;
        this = (SceneGraph *)local_38;
      }
    }
    else {
      (**(code **)(*plVar5 + 0x10))(plVar5);
      lVar2 = plVar5[0xd];
      if (mblur) {
        pSVar6 = this;
        if ((plVar5[0xe] == lVar2) || (1 < *(ulong *)(lVar2 + 0x10))) {
LAB_0014aca1:
          *(Node **)pSVar6 = (Node *)0x0;
          (**(code **)(*plVar5 + 0x18))(plVar5);
          return (Ref<embree::SceneGraph::Node>)(Node *)this;
        }
      }
      else if ((plVar5[0xe] != lVar2) && (1 < *(ulong *)(lVar2 + 0x10))) {
        *(Node **)this = node->ptr;
        pSVar6 = (SceneGraph *)node;
        goto LAB_0014aca1;
      }
      local_50.ptr = (Node *)plVar5[0x10];
      if (local_50.ptr != (Node *)0x0) {
        (*((local_50.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      remove_mblur((SceneGraph *)&local_60,&local_50,mblur);
      if ((long *)plVar5[0x10] != (long *)0x0) {
        (**(code **)(*(long *)plVar5[0x10] + 0x18))();
      }
      plVar5[0x10] = local_60;
      if (local_50.ptr != (Node *)0x0) {
        (*((local_50.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      (**(code **)(*plVar5 + 0x18))(plVar5);
    }
    goto LAB_0014ad29;
  }
  (**(code **)(*plVar5 + 0x10))(plVar5);
  if (mblur) {
    if (1 < (ulong)plVar5[0xf]) {
      *(undefined8 *)this = 0;
      goto LAB_0014ab66;
    }
LAB_0014ab6a:
    local_48.ptr = (Node *)plVar5[0x13];
    if (local_48.ptr != (Node *)0x0) {
      (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    remove_mblur((SceneGraph *)&local_60,&local_48,mblur);
    if ((long *)plVar5[0x13] != (long *)0x0) {
      (**(code **)(*(long *)plVar5[0x13] + 0x18))();
    }
    plVar5[0x13] = local_60;
    if (local_48.ptr != (Node *)0x0) {
      (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    bVar4 = true;
  }
  else {
    if ((ulong)plVar5[0xf] < 2) goto LAB_0014ab6a;
    *(Node **)this = node->ptr;
    node->ptr = (Node *)0x0;
LAB_0014ab66:
    bVar4 = false;
  }
  (**(code **)(*plVar5 + 0x18))(plVar5);
  if (!bVar4) {
    return (Ref<embree::SceneGraph::Node>)(Node *)this;
  }
LAB_0014ad29:
  (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
  node->ptr = (Node *)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::remove_mblur(Ref<SceneGraph::Node> node, bool mblur)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      if (mblur) {
        if (xfmNode->spaces.size() > 1)
          return nullptr;
      } else {
        if (xfmNode->spaces.size() > 1)
          return node;
      }
      xfmNode->child = remove_mblur(xfmNode->child, mblur);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      if (mblur) {
        if (xfmNode->spaces.size() == 0 || xfmNode->spaces[0].size() > 1)
          return nullptr;
      } else {
        if (xfmNode->spaces.size() > 0 && xfmNode->spaces[0].size() > 1)
          return node;
      }
      xfmNode->child = remove_mblur(xfmNode->child, mblur);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>())
    {
      for (size_t i=0; i<groupNode->children.size(); i++)
        groupNode->children[i] = remove_mblur(groupNode->children[i], mblur);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    return node;
  }